

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O1

MD_MARKSTACK * md_opener_stack(MD_CTX *ctx,int mark_index)

{
  MD_MARK *pMVar1;
  byte bVar2;
  MD_MARKSTACK *pMVar3;
  MD_MARKSTACK *pMVar4;
  
  pMVar1 = ctx->marks + mark_index;
  bVar2 = pMVar1->ch;
  if (bVar2 < 0x5b) {
    if (bVar2 == 0x21) goto LAB_0010b591;
  }
  else {
    if (bVar2 == 0x5b) {
LAB_0010b591:
      return ctx->opener_stacks + 0xe;
    }
    if (bVar2 == 0x7e) {
      return ctx->opener_stacks + (ulong)(pMVar1->end - pMVar1->beg != 1) + 0xc;
    }
  }
  pMVar4 = ctx->opener_stacks;
  if (bVar2 != 0x2a) {
    pMVar4 = ctx->opener_stacks + 6;
  }
  pMVar3 = pMVar4 + 3;
  if ((pMVar1->flags & 0x20) == 0) {
    pMVar3 = pMVar4;
  }
  bVar2 = pMVar1->flags >> 6;
  if (bVar2 == 1) {
    return pMVar3;
  }
  if (bVar2 != 3) {
    return pMVar3 + 1;
  }
  return pMVar3 + 2;
}

Assistant:

static MD_MARKSTACK*
md_opener_stack(MD_CTX* ctx, int mark_index)
{
    MD_MARK* mark = &ctx->marks[mark_index];

    switch(mark->ch) {
        case _T('*'):
        case _T('_'):   return md_emph_stack(ctx, mark->ch, mark->flags);

        case _T('~'):   return (mark->end - mark->beg == 1) ? &TILDE_OPENERS_1 : &TILDE_OPENERS_2;

        case _T('!'):
        case _T('['):   return &BRACKET_OPENERS;

        default:        MD_UNREACHABLE();
    }
}